

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O2

void test_broadcast(void)

{
  socklen_t in_ECX;
  int __oflag;
  int __oflag_00;
  sockaddr *__addr;
  char *in_RSI;
  char *__file;
  long *local_80;
  thread t2;
  thread t1;
  UDPsocket cs;
  UDPsocket ss;
  
  UDPsocket::UDPsocket(&ss);
  UDPsocket::open(&ss,in_RSI,__oflag);
  __file = (char *)0x7e4;
  UDPsocket::bind(&ss,0x7e4,__addr,in_ECX);
  UDPsocket::UDPsocket(&cs);
  UDPsocket::open(&cs,__file,__oflag_00);
  UDPsocket::broadcast(&cs,1);
  t1._M_id._M_thread = (id)0;
  local_80 = (long *)operator_new(0x18);
  *local_80 = (long)&PTR___State_00104d50;
  local_80[1] = (long)&ss;
  local_80[2] = (long)&cs;
  std::thread::_M_start_thread(&t1,&local_80,0);
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  t2._M_id._M_thread = (id)0;
  local_80 = (long *)operator_new(0x10);
  *local_80 = (long)&PTR___State_00104d90;
  local_80[1] = (long)&cs;
  std::thread::_M_start_thread(&t2,&local_80,0);
  if (local_80 != (long *)0x0) {
    (**(code **)(*local_80 + 8))();
  }
  std::thread::join();
  std::thread::join();
  std::thread::~thread(&t2);
  std::thread::~thread(&t1);
  UDPsocket::~UDPsocket(&cs);
  UDPsocket::~UDPsocket(&ss);
  return;
}

Assistant:

void test_broadcast()
{
	UDPsocket ss;
	ss.open();
	ss.bind(PortNo);

	UDPsocket cs;
	cs.open();
	cs.broadcast(true);

	auto t1 = std::thread([&ss, &cs]
	{
		std::this_thread::sleep_for(IterDuration * 1.25);
		for (uint16_t i = 0; i < 2 * IterCount; ++i)
		{
			UDPsocket::IPv4 ipaddr;
			std::string data;
			if (ss.recv(data, ipaddr) < 0)
			{
				fprintf(stderr, "recv(): failed\n");
			}
			else
			{
				if (!data.empty())
				{
					fprintf(stderr, "%s  '%s'\n", ipaddr.to_string().c_str(), data.c_str());
					if (data.compare(0, 8, "MESSAGE?"s) == 0)
					{
						ipaddr.port = PortNo;
						if ((i & 0x2 ? cs : ss).send("MESSAGE!"s, ipaddr) < 0)
						{
							fprintf(stderr, "send(): failed (REP)\n");
						}
					}
				}
			}
		}
		ss.close();
	});

	auto t2 = std::thread([&cs]
	{
		for (uint8_t i = 0; i < IterCount; ++i)
		{
			if (cs.send("MESSAGE?"s, UDPsocket::IPv4::Broadcast(PortNo)) < 0)
			{
				fprintf(stderr, "send(): failed (REQ)\n");
			}
			std::this_thread::sleep_for(IterDuration);
		}
		cs.close();
	});

	t1.join();
	t2.join();
}